

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall
embree::ISPCScene::ISPCScene
          (ISPCScene *this,RTCDevice device,uint numGeometries,uint numMaterials,uint numLights)

{
  undefined8 uVar1;
  void *pvVar2;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t in_stack_ffffffffffffffb8;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  
  uVar1 = rtcNewScene(in_RSI);
  *in_RDI = uVar1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(uint *)(in_RDI + 3) = in_EDX;
  *(uint *)((long)in_RDI + 0x1c) = in_ECX;
  in_RDI[4] = 0;
  *(uint *)(in_RDI + 5) = in_R8D;
  in_RDI[6] = 0;
  pvVar2 = alignedUSMMalloc((size_t)in_RDI,in_stack_ffffffffffffffb8,DEFAULT);
  in_RDI[1] = pvVar2;
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    *(undefined8 *)(in_RDI[1] + local_28 * 8) = 0;
  }
  pvVar2 = alignedUSMMalloc((size_t)in_RDI,in_stack_ffffffffffffffb8,DEFAULT);
  in_RDI[2] = pvVar2;
  for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
    *(undefined8 *)(in_RDI[2] + local_30 * 8) = 0;
  }
  pvVar2 = alignedUSMMalloc((size_t)in_RDI,in_stack_ffffffffffffffb8,DEFAULT);
  in_RDI[4] = pvVar2;
  for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
    *(undefined8 *)(in_RDI[4] + local_38 * 8) = 0;
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, unsigned int numGeometries, unsigned int numMaterials, unsigned int numLights)
    : scene(rtcNewScene(device)), geometries(nullptr), materials(nullptr), numGeometries(numGeometries), numMaterials(numMaterials), lights(0), numLights(numLights), tutorialScene(nullptr)
  {
    geometries = (ISPCGeometry**) alignedUSMMalloc(numGeometries*sizeof(ISPCGeometry*));
    for (size_t i=0; i<numGeometries; i++) geometries[i] = nullptr;
    
    materials = (ISPCMaterial**) alignedUSMMalloc(numMaterials*sizeof(ISPCMaterial*));
    for (size_t i=0; i<numMaterials; i++) materials[i] = nullptr;
    
    lights = (Light**) alignedUSMMalloc(numLights*sizeof(Light*));
    for (size_t i=0; i<numLights; i++) lights[i] = nullptr;
  }